

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O1

void __thiscall
SQCompilation::FunctionReturnTypeEvaluator::checkCompoundBin
          (FunctionReturnTypeEvaluator *this,BinExpr *expr)

{
  byte *pbVar1;
  TreeOp TVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  TVar2 = (expr->super_Expr).super_Node._op;
  uVar5 = this->flags;
  this->flags = 0;
  checkExpr(this,expr->_lhs);
  uVar3 = this->flags;
  this->flags = 0;
  checkExpr(this,expr->_rhs);
  uVar4 = this->flags;
  this->flags = uVar5;
  if ((TVar2 == TO_NULLC) ||
     (((uVar4 & 8) == 0 || (uVar3 & 4) == 0 && ((uVar3 & 8) == 0 || (uVar4 & 4) == 0)))) {
    if ((uVar4 & 2) == 0) {
      if (((uVar4 | uVar3) & 0x10) == 0) {
        uVar5 = uVar5 | uVar4 & 0xfffffcfd;
      }
      else {
        uVar5 = uVar5 | 0x10;
      }
    }
    else {
      uVar5 = uVar5 | 2;
    }
  }
  else {
    uVar5 = uVar5 | 4;
  }
  this->flags = uVar5;
  if (((uVar4 | uVar3) >> 8 & 1) != 0) {
    pbVar1 = (byte *)((long)&this->flags + 1);
    *pbVar1 = *pbVar1 | 1;
  }
  return;
}

Assistant:

void FunctionReturnTypeEvaluator::checkCompoundBin(const BinExpr *expr) {
  enum TreeOp op = expr->op();

  assert(op == TO_ANDAND || op == TO_OROR || op == TO_NULLC);

  unsigned old = flags;
  flags = 0;

  checkExpr(expr->lhs());

  unsigned lhsFlags = flags;
  flags = 0;

  checkExpr(expr->rhs());

  unsigned rhsFlags = flags;
  flags = old;

  lhsFlags &= ~RT_UNRECOGNIZED;
  rhsFlags &= ~RT_UNRECOGNIZED;

  bool hasFuncCall = (lhsFlags | rhsFlags) & RT_FUNCTION_CALL;

  lhsFlags &= ~RT_FUNCTION_CALL;
  rhsFlags &= ~RT_FUNCTION_CALL;

  if (op != TO_NULLC && (((lhsFlags & RT_BOOL) && (rhsFlags & RT_NUMBER)) || ((rhsFlags & RT_BOOL) && (lhsFlags & RT_NUMBER))))
    flags |= RT_BOOL;
  else if (rhsFlags & RT_NULL)
    flags |= RT_NULL;
  else if ((lhsFlags | rhsFlags) & RT_STRING)
    flags |= RT_STRING;
  else
    flags |= rhsFlags;

  if (hasFuncCall)
    flags |= RT_FUNCTION_CALL;
}